

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

void __thiscall BigInteger::BigInteger(BigInteger *this,string *s)

{
  undefined1 uVar1;
  reference pcVar2;
  undefined8 uVar3;
  char *in_RDI;
  const_reverse_iterator i;
  uint pow;
  uint temp;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  BigInteger *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff90;
  int local_18;
  
  memset(in_RDI,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x14e05a);
  in_RDI[0x18] = '\0';
  local_18 = 1;
  std::__cxx11::string::crbegin();
  do {
    std::__cxx11::string::crend();
    uVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffff50,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!(bool)uVar1) {
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff50,
                      (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      normalize(in_stack_ffffffffffffff50);
      return;
    }
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffff50);
    if ((*pcVar2 == '-') ||
       (pcVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_ffffffffffffff50), *pcVar2 == '+')) {
      pcVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffff50);
      if (*pcVar2 == '-') {
        in_RDI[0x18] = '\x01';
      }
    }
    else {
      pcVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffff50);
      if ((*pcVar2 < '0') ||
         (in_stack_ffffffffffffff60 =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffff50),
         '9' < *(char *)&(in_stack_ffffffffffffff60->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start)) {
        uVar3 = __cxa_allocate_exception(0x10);
        std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,in_stack_ffffffffffffff90));
        invalid_number_error::runtime_error
                  ((invalid_number_error *)in_stack_ffffffffffffff50,
                   (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        __cxa_throw(uVar3,&invalid_number_error::typeinfo,
                    invalid_number_error::~invalid_number_error);
      }
      in_stack_ffffffffffffff4c = local_18;
      in_stack_ffffffffffffff50 =
           (BigInteger *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff50);
      local_18 = local_18 * 10;
      if (local_18 == 1000000000) {
        local_18 = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff50);
  } while( true );
}

Assistant:

BigInteger::BigInteger(const std::string &s): digits(), negative(false)
{
    unsigned temp = 0;
    unsigned pow = 1;
    for(auto i = s.crbegin(); i != s.crend(); ++i)
    {
        if(*i == '-' || *i == '+')
        {
            if(*i == '-')
                negative = true;
            continue;
        }
        if(*i < '0' || *i > '9')
            throw invalid_number_error("Invalid integer: " + s);
        temp += pow * (*i - '0');
        pow *= 10;
        if(pow == BLOCK_MOD)
        {
            pow = 1;
            digits.push_back(temp);
            temp = 0;
        }
    }
    if(s == "-")
        temp = 1;
    digits.push_back(temp);
    normalize();
}